

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::UnaryOpExpr::UnaryOpExpr
          (UnaryOpExpr *this,Location *loc,shared_ptr<minja::Expression> *e,Op o)

{
  undefined4 in_ECX;
  Location *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  Expression::Expression((Expression *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI);
  (in_RDI->source).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR_do_evaluate_004288c8;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             (shared_ptr<minja::Expression> *)in_RDI);
  *(undefined4 *)
   &in_RDI[2].source.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = in_ECX;
  return;
}

Assistant:

UnaryOpExpr(const Location & loc, std::shared_ptr<Expression> && e, Op o)
      : Expression(loc), expr(std::move(e)), op(o) {}